

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ScatterAlongAxisLayerParams::SerializeWithCachedSizes
          (ScatterAlongAxisLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(2,this->mode_,output);
    return;
  }
  return;
}

Assistant:

void ScatterAlongAxisLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ScatterAlongAxisLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // .CoreML.Specification.ScatterMode mode = 2;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ScatterAlongAxisLayerParams)
}